

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sasl_plain.c
# Opt level: O2

int saslplain_get_init_bytes
              (CONCRETE_SASL_MECHANISM_HANDLE sasl_mechanism_concrete_handle,
              SASL_MECHANISM_BYTES *init_bytes)

{
  LOGGER_LOG p_Var1;
  SASL_PLAIN_INSTANCE *sasl_plain_instance;
  int iVar2;
  
  if (sasl_mechanism_concrete_handle == (CONCRETE_SASL_MECHANISM_HANDLE)0x0 ||
      init_bytes == (SASL_MECHANISM_BYTES *)0x0) {
    p_Var1 = xlogging_get_log_function();
    iVar2 = 0x9c;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/sasl_plain.c"
                ,"saslplain_get_init_bytes",0x9b,1,
                "Bad arguments: sasl_mechanism_concrete_handle = %p, init_bytes = %p",
                sasl_mechanism_concrete_handle,init_bytes);
    }
  }
  else {
    init_bytes->bytes = *sasl_mechanism_concrete_handle;
    init_bytes->length = *(uint32_t *)((long)sasl_mechanism_concrete_handle + 8);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int saslplain_get_init_bytes(CONCRETE_SASL_MECHANISM_HANDLE sasl_mechanism_concrete_handle, SASL_MECHANISM_BYTES* init_bytes)
{
    int result;

    if ((sasl_mechanism_concrete_handle == NULL) ||
        (init_bytes == NULL))
    {
        /* Codes_SRS_SASL_PLAIN_01_009: [If any argument is NULL, `saslplain_get_init_bytes` shall return a non-zero value.] */
        LogError("Bad arguments: sasl_mechanism_concrete_handle = %p, init_bytes = %p",
            sasl_mechanism_concrete_handle, init_bytes);
        result = MU_FAILURE;
    }
    else
    {
        SASL_PLAIN_INSTANCE* sasl_plain_instance = (SASL_PLAIN_INSTANCE*)sasl_mechanism_concrete_handle;

        /* Codes_SRS_SASL_PLAIN_01_007: [`saslplain_get_init_bytes` shall construct the initial bytes per the RFC 4616.] */
        init_bytes->bytes = sasl_plain_instance->init_bytes;
        init_bytes->length = sasl_plain_instance->init_bytes_length;

        /* Codes_SRS_SASL_PLAIN_01_008: [On success `saslplain_get_init_bytes` shall return zero.] */
        result = 0;
    }

    return result;
}